

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint RDL_getRCycles_internal(RDL_data *data,RDL_cycle ***ptr,RDL_cycleIterator *it)

{
  int iVar1;
  void *__ptr;
  RDL_cycle *pRVar2;
  RDL_graph *pRVar3;
  uint uVar4;
  ulong uVar5;
  
  __ptr = malloc(0x200);
  iVar1 = RDL_cycleIteratorAtEnd((RDL_cycleIterator *)ptr);
  uVar4 = 0;
  if (iVar1 == 0) {
    uVar5 = 0x40;
    uVar4 = 0;
    do {
      if (uVar4 == (uint)uVar5) {
        uVar5 = (ulong)((uint)uVar5 * 2);
        __ptr = realloc(__ptr,uVar5 * 8);
      }
      pRVar2 = RDL_cycleIteratorGetCycle((RDL_cycleIterator *)ptr);
      *(RDL_cycle **)((long)__ptr + (ulong)uVar4 * 8) = pRVar2;
      uVar4 = uVar4 + 1;
      RDL_cycleIteratorNext((RDL_cycleIterator *)ptr);
      iVar1 = RDL_cycleIteratorAtEnd((RDL_cycleIterator *)ptr);
    } while (iVar1 == 0);
  }
  RDL_deleteCycleIterator((RDL_cycleIterator *)ptr);
  pRVar3 = (RDL_graph *)realloc(__ptr,(ulong)uVar4 << 3);
  data->graph = pRVar3;
  return uVar4;
}

Assistant:

static unsigned RDL_getRCycles_internal(
    const RDL_data *data, RDL_cycle ***ptr, RDL_cycleIterator* it)
{
  RDL_cycle **result;
  unsigned alloced, nextfree;

  alloced = RDL_RESERVED_START;
  nextfree = 0;
  result = malloc(alloced * sizeof(*result));

  while (!RDL_cycleIteratorAtEnd(it)) {
    if(nextfree == alloced) {
      alloced *= 2;
      result = realloc(result, alloced * sizeof(*result));
    }
    result[nextfree] = RDL_cycleIteratorGetCycle(it);
    ++nextfree;

    RDL_cycleIteratorNext(it);
  }
  RDL_deleteCycleIterator(it);

  result = realloc(result, nextfree * sizeof(*result));

  *ptr = result;
  return nextfree;
}